

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_16x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  unkuint9 Var8;
  undefined1 auVar9 [11];
  undefined1 auVar10 [13];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  int y_mask;
  uint uVar13;
  undefined1 auVar14 [16];
  ushort uVar15;
  ushort uVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar23 [16];
  ushort uVar24;
  ushort uVar25;
  short sVar26;
  ushort uVar29;
  short sVar31;
  ushort uVar32;
  ushort uVar34;
  ushort uVar36;
  ushort uVar38;
  ushort uVar40;
  undefined1 auVar27 [16];
  ushort uVar30;
  ushort uVar33;
  ushort uVar35;
  ushort uVar37;
  ushort uVar39;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  undefined1 auVar28 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar46;
  short sVar51;
  short sVar54;
  short sVar57;
  short sVar60;
  ushort uVar63;
  ushort uVar64;
  short sVar65;
  ushort uVar68;
  ushort uVar69;
  short sVar70;
  ushort uVar73;
  ushort uVar74;
  undefined1 auVar49 [16];
  ushort uVar47;
  ushort uVar48;
  ushort uVar52;
  ushort uVar53;
  ushort uVar55;
  ushort uVar56;
  ushort uVar58;
  ushort uVar59;
  ushort uVar61;
  ushort uVar62;
  ushort uVar66;
  ushort uVar67;
  ushort uVar71;
  ushort uVar72;
  short sVar75;
  ushort uVar76;
  ushort uVar77;
  undefined1 auVar50 [16];
  ushort uVar78;
  ushort uVar79;
  
  auVar45 = _DAT_00474a10;
  auVar14 = pshuflw(ZEXT116(left_column[0x1f]),ZEXT116(left_column[0x1f]),0);
  sVar26 = auVar14._0_2_;
  sVar31 = auVar14._2_2_;
  auVar50._2_2_ = sVar31 * 0x10;
  auVar50._0_2_ = sVar26;
  auVar50._4_2_ = sVar26 * 0x1f;
  auVar50._6_2_ = sVar31 * 0x2e;
  auVar50._8_2_ = sVar26 * 0x3c;
  auVar50._10_2_ = sVar31 * 0x4a;
  auVar50._12_2_ = sVar26 * 0x57;
  auVar50._14_2_ = sVar31 * 99;
  auVar23._0_2_ = sVar26 * 0xbe;
  auVar23._2_2_ = sVar31 * 0xc5;
  auVar23._4_2_ = sVar26 * 0xcc;
  auVar23._6_2_ = sVar31 * 0xd3;
  auVar23._8_2_ = sVar26 * 0xd9;
  auVar23._10_2_ = sVar31 * 0xde;
  auVar23._12_2_ = sVar26 * 0xe3;
  auVar23._14_2_ = sVar31 * 0xe7;
  auVar14 = *(undefined1 (*) [16])top_row;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar14._0_13_;
  auVar1[0xe] = auVar14[7];
  auVar2[0xc] = auVar14[6];
  auVar2._0_12_ = auVar14._0_12_;
  auVar2._13_2_ = auVar1._13_2_;
  auVar3[0xb] = 0;
  auVar3._0_11_ = auVar14._0_11_;
  auVar3._12_3_ = auVar2._12_3_;
  auVar4[10] = auVar14[5];
  auVar4._0_10_ = auVar14._0_10_;
  auVar4._11_4_ = auVar3._11_4_;
  auVar5[9] = 0;
  auVar5._0_9_ = auVar14._0_9_;
  auVar5._10_5_ = auVar4._10_5_;
  auVar6[8] = auVar14[4];
  auVar6._0_8_ = auVar14._0_8_;
  auVar6._9_6_ = auVar5._9_6_;
  auVar7._7_8_ = 0;
  auVar7._0_7_ = auVar6._8_7_;
  Var8 = CONCAT81(SUB158(auVar7 << 0x40,7),auVar14[3]);
  auVar11._9_6_ = 0;
  auVar11._0_9_ = Var8;
  auVar9._1_10_ = SUB1510(auVar11 << 0x30,5);
  auVar9[0] = auVar14[2];
  auVar12._11_4_ = 0;
  auVar12._0_11_ = auVar9;
  auVar10._1_12_ = SUB1512(auVar12 << 0x20,3);
  auVar10[0] = auVar14[1];
  uVar16 = (ushort)auVar14[0];
  uVar15 = (ushort)auVar14[8];
  uVar13 = 0x1000100;
  while( true ) {
    auVar44 = _DAT_00474a30;
    sVar17 = auVar10._0_2_;
    sVar18 = auVar9._0_2_;
    sVar19 = (short)Var8;
    sVar20 = auVar6._8_2_;
    sVar21 = auVar4._10_2_;
    sVar22 = auVar2._12_2_;
    uVar25 = auVar1._13_2_ >> 8;
    uVar48 = (ushort)auVar14[9];
    uVar53 = (ushort)auVar14[10];
    uVar56 = (ushort)auVar14[0xb];
    uVar59 = (ushort)auVar14[0xc];
    uVar62 = (ushort)auVar14[0xd];
    uVar67 = (ushort)auVar14[0xe];
    uVar72 = (ushort)auVar14[0xf];
    if (0xf0e0f0e < uVar13) break;
    auVar27._4_4_ = uVar13;
    auVar27._0_4_ = uVar13;
    auVar27._8_4_ = uVar13;
    auVar27._12_4_ = uVar13;
    auVar44 = pshufb(auVar45,auVar27);
    auVar49 = pshufb(auVar50,auVar27);
    sVar46 = auVar49._0_2_ + 0x80;
    sVar51 = auVar49._2_2_ + 0x80;
    sVar54 = auVar49._4_2_ + 0x80;
    sVar57 = auVar49._6_2_ + 0x80;
    sVar60 = auVar49._8_2_ + 0x80;
    sVar65 = auVar49._10_2_ + 0x80;
    sVar70 = auVar49._12_2_ + 0x80;
    sVar75 = auVar49._14_2_ + 0x80;
    uVar24 = auVar44._0_2_ * uVar16 + sVar46;
    uVar29 = auVar44._2_2_ * sVar17 + sVar51;
    uVar32 = auVar44._4_2_ * sVar18 + sVar54;
    uVar34 = auVar44._6_2_ * sVar19 + sVar57;
    uVar36 = auVar44._8_2_ * sVar20 + sVar60;
    uVar38 = auVar44._10_2_ * sVar21 + sVar65;
    uVar40 = auVar44._12_2_ * sVar22 + sVar70;
    uVar42 = auVar44._14_2_ * uVar25 + sVar75;
    uVar25 = uVar24 >> 8;
    uVar30 = uVar29 >> 8;
    uVar33 = uVar32 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar47 = sVar46 + auVar44._0_2_ * uVar15;
    uVar52 = sVar51 + auVar44._2_2_ * uVar48;
    uVar55 = sVar54 + auVar44._4_2_ * uVar53;
    uVar58 = sVar57 + auVar44._6_2_ * uVar56;
    uVar61 = sVar60 + auVar44._8_2_ * uVar59;
    uVar66 = sVar65 + auVar44._10_2_ * uVar62;
    uVar71 = sVar70 + auVar44._12_2_ * uVar67;
    uVar76 = sVar75 + auVar44._14_2_ * uVar72;
    uVar48 = uVar47 >> 8;
    uVar53 = uVar52 >> 8;
    uVar56 = uVar55 >> 8;
    uVar59 = uVar58 >> 8;
    uVar62 = uVar61 >> 8;
    uVar67 = uVar66 >> 8;
    uVar72 = uVar71 >> 8;
    uVar77 = uVar76 >> 8;
    *dst = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar25);
    dst[1] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
    dst[2] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
    dst[3] = (uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35);
    dst[4] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
    dst[5] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
    dst[6] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
    dst[7] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
    dst[8] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
    dst[9] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    dst[10] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[0xb] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    dst[0xc] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
    dst[0xd] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
    dst[0xe] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    dst[0xf] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    dst = dst + stride;
    uVar13 = uVar13 + 0x2020202;
  }
  auVar14._0_2_ = sVar26 * 0x6f;
  auVar14._2_2_ = sVar31 * 0x7b;
  auVar14._4_2_ = sVar26 * 0x86;
  auVar14._6_2_ = sVar31 * 0x91;
  auVar14._8_2_ = sVar26 * 0x9b;
  auVar14._10_2_ = sVar31 * 0xa4;
  auVar14._12_2_ = sVar26 * 0xad;
  auVar14._14_2_ = sVar31 * 0xb6;
  for (uVar13 = 0x1000100; auVar45 = _DAT_00474a50, uVar13 < 0xf0e0f0f; uVar13 = uVar13 + 0x2020202)
  {
    auVar28._4_4_ = uVar13;
    auVar28._0_4_ = uVar13;
    auVar28._8_4_ = uVar13;
    auVar28._12_4_ = uVar13;
    auVar45 = pshufb(auVar44,auVar28);
    auVar50 = pshufb(auVar14,auVar28);
    sVar46 = auVar50._0_2_ + 0x80;
    sVar51 = auVar50._2_2_ + 0x80;
    sVar54 = auVar50._4_2_ + 0x80;
    sVar57 = auVar50._6_2_ + 0x80;
    sVar60 = auVar50._8_2_ + 0x80;
    sVar65 = auVar50._10_2_ + 0x80;
    sVar70 = auVar50._12_2_ + 0x80;
    sVar75 = auVar50._14_2_ + 0x80;
    uVar24 = auVar45._0_2_ * uVar16 + sVar46;
    uVar30 = auVar45._2_2_ * sVar17 + sVar51;
    uVar33 = auVar45._4_2_ * sVar18 + sVar54;
    uVar35 = auVar45._6_2_ * sVar19 + sVar57;
    uVar37 = auVar45._8_2_ * sVar20 + sVar60;
    uVar39 = auVar45._10_2_ * sVar21 + sVar65;
    uVar41 = auVar45._12_2_ * sVar22 + sVar70;
    uVar43 = auVar45._14_2_ * uVar25 + sVar75;
    uVar29 = uVar24 >> 8;
    uVar32 = uVar30 >> 8;
    uVar34 = uVar33 >> 8;
    uVar36 = uVar35 >> 8;
    uVar38 = uVar37 >> 8;
    uVar40 = uVar39 >> 8;
    uVar42 = uVar41 >> 8;
    uVar47 = uVar43 >> 8;
    uVar52 = sVar46 + auVar45._0_2_ * uVar15;
    uVar58 = sVar51 + auVar45._2_2_ * uVar48;
    uVar66 = sVar54 + auVar45._4_2_ * uVar53;
    uVar76 = sVar57 + auVar45._6_2_ * uVar56;
    uVar63 = sVar60 + auVar45._8_2_ * uVar59;
    uVar68 = sVar65 + auVar45._10_2_ * uVar62;
    uVar73 = sVar70 + auVar45._12_2_ * uVar67;
    uVar78 = sVar75 + auVar45._14_2_ * uVar72;
    uVar55 = uVar52 >> 8;
    uVar61 = uVar58 >> 8;
    uVar71 = uVar66 >> 8;
    uVar77 = uVar76 >> 8;
    uVar64 = uVar63 >> 8;
    uVar69 = uVar68 >> 8;
    uVar74 = uVar73 >> 8;
    uVar79 = uVar78 >> 8;
    *dst = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar29);
    dst[1] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar32);
    dst[2] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[3] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
    dst[4] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
    dst[5] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    dst[6] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
    dst[7] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar47);
    dst[8] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar55);
    dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar61);
    dst[10] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar71);
    dst[0xb] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    dst[0xc] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
    dst[0xd] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
    dst[0xe] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    dst[0xf] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    dst = dst + stride;
  }
  for (uVar13 = 0x1000100; auVar14 = _DAT_00474a70, uVar13 < 0xf0e0f0f; uVar13 = uVar13 + 0x2020202)
  {
    auVar49._4_4_ = uVar13;
    auVar49._0_4_ = uVar13;
    auVar49._8_4_ = uVar13;
    auVar49._12_4_ = uVar13;
    auVar14 = pshufb(auVar45,auVar49);
    auVar50 = pshufb(auVar23,auVar49);
    sVar46 = auVar50._0_2_ + 0x80;
    sVar51 = auVar50._2_2_ + 0x80;
    sVar54 = auVar50._4_2_ + 0x80;
    sVar57 = auVar50._6_2_ + 0x80;
    sVar60 = auVar50._8_2_ + 0x80;
    sVar65 = auVar50._10_2_ + 0x80;
    sVar70 = auVar50._12_2_ + 0x80;
    sVar75 = auVar50._14_2_ + 0x80;
    uVar24 = auVar14._0_2_ * uVar16 + sVar46;
    uVar30 = auVar14._2_2_ * sVar17 + sVar51;
    uVar33 = auVar14._4_2_ * sVar18 + sVar54;
    uVar35 = auVar14._6_2_ * sVar19 + sVar57;
    uVar37 = auVar14._8_2_ * sVar20 + sVar60;
    uVar39 = auVar14._10_2_ * sVar21 + sVar65;
    uVar41 = auVar14._12_2_ * sVar22 + sVar70;
    uVar43 = auVar14._14_2_ * uVar25 + sVar75;
    uVar29 = uVar24 >> 8;
    uVar32 = uVar30 >> 8;
    uVar34 = uVar33 >> 8;
    uVar36 = uVar35 >> 8;
    uVar38 = uVar37 >> 8;
    uVar40 = uVar39 >> 8;
    uVar42 = uVar41 >> 8;
    uVar47 = uVar43 >> 8;
    uVar52 = sVar46 + auVar14._0_2_ * uVar15;
    uVar58 = sVar51 + auVar14._2_2_ * uVar48;
    uVar66 = sVar54 + auVar14._4_2_ * uVar53;
    uVar76 = sVar57 + auVar14._6_2_ * uVar56;
    uVar63 = sVar60 + auVar14._8_2_ * uVar59;
    uVar68 = sVar65 + auVar14._10_2_ * uVar62;
    uVar73 = sVar70 + auVar14._12_2_ * uVar67;
    uVar78 = sVar75 + auVar14._14_2_ * uVar72;
    uVar55 = uVar52 >> 8;
    uVar61 = uVar58 >> 8;
    uVar71 = uVar66 >> 8;
    uVar77 = uVar76 >> 8;
    uVar64 = uVar63 >> 8;
    uVar69 = uVar68 >> 8;
    uVar74 = uVar73 >> 8;
    uVar79 = uVar78 >> 8;
    *dst = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar29);
    dst[1] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar32);
    dst[2] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[3] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
    dst[4] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
    dst[5] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    dst[6] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
    dst[7] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar47);
    dst[8] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar55);
    dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar61);
    dst[10] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar71);
    dst[0xb] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    dst[0xc] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
    dst[0xd] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
    dst[0xe] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    dst[0xf] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    dst = dst + stride;
  }
  auVar45._0_2_ = sVar26 * 0xeb;
  auVar45._2_2_ = sVar31 * 0xef;
  auVar45._4_2_ = sVar26 * 0xf2;
  auVar45._6_2_ = sVar31 * 0xf4;
  auVar45._8_2_ = sVar26 * 0xf6;
  auVar45._10_2_ = sVar31 * 0xf7;
  auVar45._12_2_ = sVar26 * 0xf8;
  auVar45._14_2_ = sVar31 * 0xf8;
  for (uVar13 = 0x1000100; uVar13 < 0xf0e0f0f; uVar13 = uVar13 + 0x2020202) {
    auVar44._4_4_ = uVar13;
    auVar44._0_4_ = uVar13;
    auVar44._8_4_ = uVar13;
    auVar44._12_4_ = uVar13;
    auVar23 = pshufb(auVar14,auVar44);
    auVar50 = pshufb(auVar45,auVar44);
    sVar26 = auVar50._0_2_ + 0x80;
    sVar31 = auVar50._2_2_ + 0x80;
    sVar46 = auVar50._4_2_ + 0x80;
    sVar51 = auVar50._6_2_ + 0x80;
    sVar54 = auVar50._8_2_ + 0x80;
    sVar57 = auVar50._10_2_ + 0x80;
    sVar60 = auVar50._12_2_ + 0x80;
    sVar65 = auVar50._14_2_ + 0x80;
    uVar24 = auVar23._0_2_ * uVar16 + sVar26;
    uVar30 = auVar23._2_2_ * sVar17 + sVar31;
    uVar33 = auVar23._4_2_ * sVar18 + sVar46;
    uVar35 = auVar23._6_2_ * sVar19 + sVar51;
    uVar37 = auVar23._8_2_ * sVar20 + sVar54;
    uVar39 = auVar23._10_2_ * sVar21 + sVar57;
    uVar41 = auVar23._12_2_ * sVar22 + sVar60;
    uVar43 = auVar23._14_2_ * uVar25 + sVar65;
    uVar29 = uVar24 >> 8;
    uVar32 = uVar30 >> 8;
    uVar34 = uVar33 >> 8;
    uVar36 = uVar35 >> 8;
    uVar38 = uVar37 >> 8;
    uVar40 = uVar39 >> 8;
    uVar42 = uVar41 >> 8;
    uVar47 = uVar43 >> 8;
    uVar52 = sVar26 + auVar23._0_2_ * uVar15;
    uVar58 = sVar31 + auVar23._2_2_ * uVar48;
    uVar66 = sVar46 + auVar23._4_2_ * uVar53;
    uVar76 = sVar51 + auVar23._6_2_ * uVar56;
    uVar63 = sVar54 + auVar23._8_2_ * uVar59;
    uVar68 = sVar57 + auVar23._10_2_ * uVar62;
    uVar73 = sVar60 + auVar23._12_2_ * uVar67;
    uVar78 = sVar65 + auVar23._14_2_ * uVar72;
    uVar55 = uVar52 >> 8;
    uVar61 = uVar58 >> 8;
    uVar71 = uVar66 >> 8;
    uVar77 = uVar76 >> 8;
    uVar64 = uVar63 >> 8;
    uVar69 = uVar68 >> 8;
    uVar74 = uVar73 >> 8;
    uVar79 = uVar78 >> 8;
    *dst = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar29);
    dst[1] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar32);
    dst[2] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst[3] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
    dst[4] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
    dst[5] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    dst[6] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
    dst[7] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar47);
    dst[8] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar55);
    dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar61);
    dst[10] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar71);
    dst[0xb] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    dst[0xc] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
    dst[0xd] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
    dst[0xe] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    dst[0xf] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_16x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i zero = _mm_setzero_si128();
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(128);

  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = _mm_unpackhi_epi8(top, zero);
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}